

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall
Plan::DyndepsLoaded(Plan *this,DependencyScan *scan,Node *node,DyndepFile *ddf,string *err)

{
  ulong uVar1;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  pointer ppEVar10;
  _Rb_tree_header *p_Var11;
  iterator want_e;
  _Rb_tree_header *p_Var12;
  _Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *p_Var13;
  vector<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_>_>_>
  dyndep_roots;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> dyndep_walk;
  _Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *local_88;
  iterator iStack_80;
  _Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *local_78;
  Node *local_68;
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_60;
  
  bVar3 = RefreshDyndepDependents(this,scan,node,err);
  if (bVar3) {
    local_88 = (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)0x0;
    iStack_80._M_current = (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)0x0;
    local_78 = (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)0x0;
    local_60._M_impl._0_8_ =
         (ddf->
         super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(ddf->
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               )._M_t._M_impl.super__Rb_tree_header;
    local_68 = node;
    if ((_Rb_tree_header *)local_60._M_impl._0_8_ != p_Var12) {
      p_Var11 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
      do {
        uVar1 = *(ulong *)(local_60._M_impl._0_8_ + 0x20);
        if (*(char *)(uVar1 + 0x54) == '\0') {
          p_Var7 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = &p_Var11->_M_header;
          for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
              p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < uVar1]) {
            if (*(ulong *)(p_Var7 + 1) >= uVar1) {
              p_Var5 = p_Var7;
            }
          }
          p_Var9 = p_Var11;
          if (((_Rb_tree_header *)p_Var5 != p_Var11) &&
             (p_Var9 = (_Rb_tree_header *)p_Var5, uVar1 < ((_Rb_tree_header *)p_Var5)->_M_node_count
             )) {
            p_Var9 = p_Var11;
          }
          if (p_Var9 != p_Var11) {
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::_Rb_tree_const_iterator<std::pair<Edge*const,Dyndeps>>,std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge*const,Dyndeps>>>>
              ::_M_realloc_insert<std::_Rb_tree_const_iterator<std::pair<Edge*const,Dyndeps>>const&>
                        ((vector<std::_Rb_tree_const_iterator<std::pair<Edge*const,Dyndeps>>,std::allocator<std::_Rb_tree_const_iterator<std::pair<Edge*const,Dyndeps>>>>
                          *)&local_88,iStack_80,
                         (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)&local_60);
            }
            else {
              (iStack_80._M_current)->_M_node = (_Base_ptr)local_60._M_impl._0_8_;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
        local_60._M_impl._0_8_ =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_60._M_impl._0_8_);
      } while ((_Rb_tree_header *)local_60._M_impl._0_8_ != p_Var12);
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_88 != iStack_80._M_current) {
      p_Var13 = local_88;
      do {
        p_Var8 = p_Var13->_M_node;
        for (p_Var7 = p_Var8[1]._M_left; p_Var7 != p_Var8[1]._M_right;
            p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
          bVar3 = AddSubTarget(this,*(Node **)p_Var7,
                               (Node *)**(undefined8 **)(*(long *)(p_Var8 + 1) + 0x28),err,
                               (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)&local_60)
          ;
          if ((!bVar3) && (err->_M_string_length != 0)) {
            bVar3 = false;
            goto LAB_0010899b;
          }
        }
        p_Var13 = p_Var13 + 1;
      } while (p_Var13 != iStack_80._M_current);
    }
    pNVar2 = local_68;
    ppEVar10 = (local_68->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppEVar10 !=
        (local_68->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var12 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var7 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var12->_M_header;
        if (p_Var7 != (_Base_ptr)0x0) {
          do {
            if (*(Edge **)(p_Var7 + 1) >= *ppEVar10) {
              p_Var5 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[*(Edge **)(p_Var7 + 1) < *ppEVar10];
          } while (p_Var7 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var12;
        if (((_Rb_tree_header *)p_Var5 != p_Var12) &&
           (p_Var11 = (_Rb_tree_header *)p_Var5,
           *ppEVar10 < (Edge *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var11 = p_Var12;
        }
        if (p_Var11 != p_Var12) {
          std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
          _M_insert_unique<Edge*const&>
                    ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                      *)&local_60,(Edge **)&p_Var11->_M_node_count);
        }
        ppEVar10 = ppEVar10 + 1;
      } while (ppEVar10 !=
               (pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    p_Var12 = &local_60._M_impl.super__Rb_tree_header;
    bVar3 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var12;
    if (!bVar3) {
      p_Var11 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var8 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var11->_M_header;
        if (p_Var8 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var8 + 1) >= *(ulong *)(p_Var7 + 1)) {
              p_Var6 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < *(ulong *)(p_Var7 + 1)];
          } while (p_Var8 != (_Base_ptr)0x0);
        }
        want_e._M_node = &p_Var11->_M_header;
        if (((_Rb_tree_header *)p_Var6 != p_Var11) &&
           (want_e._M_node = p_Var6, *(ulong *)(p_Var7 + 1) < *(ulong *)(p_Var6 + 1))) {
          want_e._M_node = &p_Var11->_M_header;
        }
        if ((_Rb_tree_header *)want_e._M_node == p_Var11) {
          bVar4 = false;
        }
        else {
          bVar4 = EdgeMaybeReady(this,want_e,err);
          bVar4 = !bVar4;
        }
        if (bVar4) break;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        bVar3 = (_Rb_tree_header *)p_Var7 == p_Var12;
      } while (!bVar3);
    }
LAB_0010899b:
    std::
    _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>::
    ~_Rb_tree(&local_60);
    if (local_88 != (_Rb_tree_const_iterator<std::pair<Edge_*const,_Dyndeps>_> *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Plan::DyndepsLoaded(DependencyScan* scan, const Node* node,
                         const DyndepFile& ddf, string* err) {
  // Recompute the dirty state of all our direct and indirect dependents now
  // that our dyndep information has been loaded.
  if (!RefreshDyndepDependents(scan, node, err))
    return false;

  // We loaded dyndep information for those out_edges of the dyndep node that
  // specify the node in a dyndep binding, but they may not be in the plan.
  // Starting with those already in the plan, walk newly-reachable portion
  // of the graph through the dyndep-discovered dependencies.

  // Find edges in the the build plan for which we have new dyndep info.
  std::vector<DyndepFile::const_iterator> dyndep_roots;
  for (DyndepFile::const_iterator oe = ddf.begin(); oe != ddf.end(); ++oe) {
    Edge* edge = oe->first;

    // If the edge outputs are ready we do not need to consider it here.
    if (edge->outputs_ready())
      continue;

    map<Edge*, Want>::iterator want_e = want_.find(edge);

    // If the edge has not been encountered before then nothing already in the
    // plan depends on it so we do not need to consider the edge yet either.
    if (want_e == want_.end())
      continue;

    // This edge is already in the plan so queue it for the walk.
    dyndep_roots.push_back(oe);
  }

  // Walk dyndep-discovered portion of the graph to add it to the build plan.
  std::set<Edge*> dyndep_walk;
  for (std::vector<DyndepFile::const_iterator>::iterator
       oei = dyndep_roots.begin(); oei != dyndep_roots.end(); ++oei) {
    DyndepFile::const_iterator oe = *oei;
    for (vector<Node*>::const_iterator i = oe->second.implicit_inputs_.begin();
         i != oe->second.implicit_inputs_.end(); ++i) {
      if (!AddSubTarget(*i, oe->first->outputs_[0], err, &dyndep_walk) &&
          !err->empty())
        return false;
    }
  }

  // Add out edges from this node that are in the plan (just as
  // Plan::NodeFinished would have without taking the dyndep code path).
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;
    dyndep_walk.insert(want_e->first);
  }

  // See if any encountered edges are now ready.
  for (set<Edge*>::iterator wi = dyndep_walk.begin();
       wi != dyndep_walk.end(); ++wi) {
    map<Edge*, Want>::iterator want_e = want_.find(*wi);
    if (want_e == want_.end())
      continue;
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }

  return true;
}